

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O0

void __thiscall Assimp::LWOImporter::LoadLWO2Envelope(LWOImporter *this,uint length)

{
  uint16_t uVar1;
  uint uVar2;
  uint32_t uVar3;
  DeadlyImportError *pDVar4;
  vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_> *this_00;
  size_type sVar5;
  reference pvVar6;
  Logger *pLVar7;
  float fVar8;
  Key *key_1;
  string local_1c8;
  reference local_1a8;
  Key *key;
  undefined1 local_172;
  allocator local_171;
  string local_170;
  undefined1 local_14a;
  allocator local_149;
  string local_148;
  undefined1 local_122;
  allocator local_121;
  string local_120;
  undefined1 local_fa;
  allocator local_f9;
  string local_f8;
  uint8_t *local_d8;
  uint8_t *next;
  string local_c8;
  SubChunkHeader local_a4;
  SubChunkHeader head;
  uint32_t extra;
  Envelope *envelope;
  undefined1 local_55;
  allocator local_41;
  string local_40;
  uint8_t *local_20;
  uint8_t *end;
  LWOImporter *pLStack_10;
  uint length_local;
  LWOImporter *this_local;
  
  local_20 = this->mFileBuffer + length;
  end._4_4_ = length;
  pLStack_10 = this;
  if (length < 4) {
    local_55 = 1;
    pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40,"LWO: ENVL chunk is too small",&local_41);
    DeadlyImportError::DeadlyImportError(pDVar4,&local_40);
    local_55 = 0;
    __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  LWO::Envelope::Envelope((Envelope *)&envelope);
  std::vector<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>::push_back
            (&this->mEnvelopes,(Envelope *)&envelope);
  LWO::Envelope::~Envelope((Envelope *)&envelope);
  register0x00000000 =
       std::vector<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>::back
                 (&this->mEnvelopes);
  uVar2 = ReadVSizedIntLWO2(this,&this->mFileBuffer);
  stack0xffffffffffffff68->index = uVar2;
  if (((this->mIsLXOB & 1U) != 0) && (head.type = GetU4(this), head.type != 0)) {
    this->mFileBuffer = this->mFileBuffer + -4;
  }
  while( true ) {
    if (local_20 <= this->mFileBuffer + 6) {
      return;
    }
    local_a4 = IFF::LoadSubChunk(&this->mFileBuffer);
    if (local_20 < this->mFileBuffer + (int)(uint)local_a4.length) break;
    local_d8 = this->mFileBuffer + local_a4.length;
    if (local_a4.type == 0x4b455920) {
      if (local_a4.length < 8) {
        local_172 = 1;
        pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_170,"LWO: KEY chunk is too small",&local_171);
        DeadlyImportError::DeadlyImportError(pDVar4,&local_170);
        local_172 = 0;
        __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      this_00 = &stack0xffffffffffffff68->keys;
      LWO::Key::Key((Key *)&key);
      std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::push_back
                (this_00,(value_type *)&key);
      local_1a8 = std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::back
                            (&stack0xffffffffffffff68->keys);
      fVar8 = GetF4(this);
      local_1a8->time = (double)fVar8;
      fVar8 = GetF4(this);
      local_1a8->value = fVar8;
    }
    else if (local_a4.type == 0x504f5354) {
      if (local_a4.length < 2) {
        local_14a = 1;
        pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_148,"LWO: POST chunk is too small",&local_149)
        ;
        DeadlyImportError::DeadlyImportError(pDVar4,&local_148);
        local_14a = 0;
        __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      uVar1 = GetU2(this);
      stack0xffffffffffffff68->post = (uint)uVar1;
    }
    else if (local_a4.type == 0x50524520) {
      if (local_a4.length < 2) {
        local_122 = 1;
        pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_120,"LWO: PRE chunk is too small",&local_121);
        DeadlyImportError::DeadlyImportError(pDVar4,&local_120);
        local_122 = 0;
        __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      uVar1 = GetU2(this);
      stack0xffffffffffffff68->pre = (uint)uVar1;
    }
    else if (local_a4.type == 0x5350414e) {
      if (local_a4.length < 4) {
        key_1._6_1_ = 1;
        pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_1c8,"LWO: SPAN chunk is too small",
                   (allocator *)((long)&key_1 + 7));
        DeadlyImportError::DeadlyImportError(pDVar4,&local_1c8);
        key_1._6_1_ = 0;
        __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      sVar5 = std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::size
                        (&stack0xffffffffffffff68->keys);
      if (sVar5 < 2) {
        pLVar7 = DefaultLogger::get();
        Logger::warn(pLVar7,"LWO2: Unexpected SPAN chunk");
      }
      else {
        pvVar6 = std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::back
                           (&stack0xffffffffffffff68->keys);
        uVar3 = GetU4(this);
        if (uVar3 == 0x42455a32) {
          pvVar6->inter = IT_BEZ2;
        }
        else if (uVar3 == 0x42455a49) {
          pvVar6->inter = IT_BEZI;
        }
        else if (uVar3 == 0x4845524d) {
          pvVar6->inter = IT_HERM;
        }
        else if (uVar3 == 0x4c494e45) {
          pvVar6->inter = IT_LINE;
        }
        else if (uVar3 == 0x53544550) {
          pvVar6->inter = IT_STEP;
        }
        else if (uVar3 == 0x54434220) {
          pvVar6->inter = IT_TCB;
        }
        else {
          pLVar7 = DefaultLogger::get();
          Logger::warn(pLVar7,"LWO2: Unknown interval interpolation mode");
        }
      }
    }
    else if (local_a4.type == 0x54595045) {
      if (local_a4.length < 2) {
        local_fa = 1;
        pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_f8,"LWO: TYPE chunk is too small",&local_f9);
        DeadlyImportError::DeadlyImportError(pDVar4,&local_f8);
        local_fa = 0;
        __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      this->mFileBuffer = this->mFileBuffer + 1;
      stack0xffffffffffffff68->type = (uint)*this->mFileBuffer;
      this->mFileBuffer = this->mFileBuffer + 1;
    }
    else {
      pLVar7 = DefaultLogger::get();
      Logger::warn(pLVar7,"LWO2: Encountered unknown ENVL subchunk");
    }
    this->mFileBuffer = local_d8;
  }
  next._6_1_ = 1;
  pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_c8,"LWO2: Invalid envelope chunk length",
             (allocator *)((long)&next + 7));
  DeadlyImportError::DeadlyImportError(pDVar4,&local_c8);
  next._6_1_ = 0;
  __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void LWOImporter::LoadLWO2Envelope(unsigned int length)
{
    LE_NCONST uint8_t* const end = mFileBuffer + length;
    AI_LWO_VALIDATE_CHUNK_LENGTH(length,ENVL,4);

    mEnvelopes.push_back(LWO::Envelope());
    LWO::Envelope& envelope = mEnvelopes.back();

    // Get the index of the envelope
    envelope.index = ReadVSizedIntLWO2(mFileBuffer);

    // It looks like there might be an extra U4 right after the index,
    // at least in modo (LXOB) files: we'll ignore it if it's zero,
    // otherwise it represents the start of a subchunk, so we backtrack.
    if (mIsLXOB)
    {
        uint32_t extra = GetU4();
        if (extra)
        {
            mFileBuffer -= 4;
        }
    }

    // ... and read all subchunks
    while (true)
    {
        if (mFileBuffer + 6 >= end)break;
        LE_NCONST IFF::SubChunkHeader head = IFF::LoadSubChunk(mFileBuffer);

        if (mFileBuffer + head.length > end)
            throw DeadlyImportError("LWO2: Invalid envelope chunk length");

        uint8_t* const next = mFileBuffer+head.length;
        switch (head.type)
        {
            // Type & representation of the envelope
        case AI_LWO_TYPE:
            AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,TYPE,2);
            mFileBuffer++; // skip user format

            // Determine type of envelope
            envelope.type  = (LWO::EnvelopeType)*mFileBuffer;
            ++mFileBuffer;
            break;

            // precondition
        case AI_LWO_PRE:
            AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,PRE,2);
            envelope.pre = (LWO::PrePostBehaviour)GetU2();
            break;

            // postcondition
        case AI_LWO_POST:
            AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,POST,2);
            envelope.post = (LWO::PrePostBehaviour)GetU2();
            break;

            // keyframe
        case AI_LWO_KEY:
            {
            AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,KEY,8);

            envelope.keys.push_back(LWO::Key());
            LWO::Key& key = envelope.keys.back();

            key.time = GetF4();
            key.value = GetF4();
            break;
            }

            // interval interpolation
        case AI_LWO_SPAN:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,SPAN,4);
                if (envelope.keys.size()<2)
                    ASSIMP_LOG_WARN("LWO2: Unexpected SPAN chunk");
                else {
                    LWO::Key& key = envelope.keys.back();
                    switch (GetU4())
                    {
                        case AI_LWO_STEP:
                            key.inter = LWO::IT_STEP;break;
                        case AI_LWO_LINE:
                            key.inter = LWO::IT_LINE;break;
                        case AI_LWO_TCB:
                            key.inter = LWO::IT_TCB;break;
                        case AI_LWO_HERM:
                            key.inter = LWO::IT_HERM;break;
                        case AI_LWO_BEZI:
                            key.inter = LWO::IT_BEZI;break;
                        case AI_LWO_BEZ2:
                            key.inter = LWO::IT_BEZ2;break;
                        default:
                            ASSIMP_LOG_WARN("LWO2: Unknown interval interpolation mode");
                    };

                    // todo ... read params
                }
                break;
            }

        default:
            ASSIMP_LOG_WARN("LWO2: Encountered unknown ENVL subchunk");
            break;
        }
        // regardless how much we did actually read, go to the next chunk
        mFileBuffer = next;
    }
}